

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

variables_map * parseArguments(int argc,char **argv)

{
  char *pcVar1;
  typed_value<unsigned_long,_char> *ptVar2;
  const_iterator cVar3;
  ostream *poVar4;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this;
  options_description options;
  undefined1 local_110 [16];
  undefined1 local_100 [56];
  long *local_c8;
  long local_b8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_a0 [24];
  void *local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  long local_68;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_60 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  this = (variables_map *)CONCAT44(in_register_0000003c,argc);
  local_110._0_8_ = (pointer)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"Usage","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_c8,(string *)local_110,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_110._0_8_ != (pointer)local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
  }
  local_110._0_8_ = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_110,"test");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"benchmark");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"path");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"tree");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"random");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"path-complete");
  ptVar2 = boost::program_options::value<unsigned_long>(&vertices);
  local_100._48_8_ = 100;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)(local_100 + 0x30));
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"vertices,v",(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>(&edges);
  local_100._40_8_ = 0x1cc;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)(local_100 + 0x28));
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"edges,e",(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>(&deletions);
  local_100._32_8_ = 0x32;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)(local_100 + 0x20));
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"deletions,d",(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_long>(&queries);
  local_100._24_8_ = 0x32;
  ptVar2 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar2,(unsigned_long *)(local_100 + 0x18));
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"queries,q",(char *)ptVar2);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"example");
  boost::program_options::options_description_easy_init::operator()(pcVar1,"help");
  boost::program_options::variables_map::variables_map(this);
  local_48.super_function_base.vtable = (vtable_base *)0x0;
  local_48.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_48.super_function_base.functor._8_8_ = 0;
  local_48.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_110,(int)argv,in_RDX,
             (options_description *)&local_c8,0,&local_48);
  boost::program_options::store((basic_parsed_options *)local_110,this,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_110);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_48);
  boost::program_options::notify(this);
  local_110._0_8_ = (pointer)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"help","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)(this + 0x10),(key_type *)local_110);
  if ((pointer)local_110._0_8_ != (pointer)local_100) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_100._0_8_ + 1));
  }
  if (1 < (int)argv && cVar3._M_node == (_Base_ptr)(this + 0x18)) {
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_60);
    if (local_88 != (void *)0x0) {
      operator_delete(local_88,local_68 - (long)local_88);
      local_88 = (void *)0x0;
      local_80 = 0;
      local_78 = 0;
      local_70 = 0;
      local_68 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_a0);
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    return this;
  }
  poVar4 = (ostream *)
           boost::program_options::operator<<
                     ((ostream *)&std::cout,(options_description *)&local_c8);
  std::operator<<(poVar4,"\n");
  exit(1);
}

Assistant:

boost::program_options::variables_map parseArguments(int argc, char *const *argv)
{
    boost::program_options::options_description options("Usage");
    options.add_options()
            ("test", "run all tests")
            ("benchmark", "run benchmark specified benchmarks")
            ("path", "run benchmark with path graph")
            ("tree", "run benchmark with tree graph")
            ("random", "run benchmark with random graph")
            ("path-complete", "run benchmark with path of complete subgraphs")
            ("vertices,v", boost::program_options::value<unsigned long>(&vertices)
                    ->default_value(100), "specify number of vertices")
            ("edges,e", boost::program_options::value<unsigned long>(&edges)
                     ->default_value(static_cast<const unsigned long &>(100*log(100))),
             "specify number of edges (only for random graphs)")
            ("deletions,d", boost::program_options::value<unsigned long>(&deletions)
                    ->default_value(50), "specify number of deletions")
            ("queries,q", boost::program_options::value<unsigned long>(&queries)
                    ->default_value(50), "specify number of queries (default 50)")
            ("example", "run an example")
            ("help", "produce help message")
            ;

    boost::program_options::variables_map vm;
    store(parse_command_line(argc, argv, options), vm);
    notify(vm);

    if (vm.count("help") || argc < 2) {
        std::cout << options << "\n";
        exit(1);
    }

    return vm;
}